

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations3L1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P1_B)

{
  iterator __position;
  double *pdVar1;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar2;
  ActualDstType actualDst;
  long lVar3;
  iterator iVar4;
  byte bVar5;
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_4,_0,_4,_4> local_118;
  Matrix<double,_4,_4,_0,_4,_4> local_98;
  
  bVar5 = 0;
  pMVar2 = &local_118;
  pdVar1 = (double *)&local_98;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = 0.0;
  lVar3 = 0;
  do {
    *pdVar1 = 1.0;
    lVar3 = lVar3 + 0x20;
    pdVar1 = pdVar1 + 5;
  } while (lVar3 != 0x80);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = -(P1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = 0.0;
  lVar3 = 0;
  do {
    *(undefined8 *)pMVar2 = 0x3ff0000000000000;
    lVar3 = lVar3 + 0x20;
    pMVar2 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar2 + 0x28);
  } while (lVar3 != 0x80);
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = -(P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = -(P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = -(P1_B->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
  _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
            ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
              *)__return_storage_ptr__,(iterator)0x0,&local_98);
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
    _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
              ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                *)__return_storage_ptr__,__position,&local_118);
  }
  else {
    pMVar2 = &local_118;
    iVar4._M_current = __position._M_current;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
      m_data.array[0] = *(double *)pMVar2;
      pMVar2 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar2 + ((ulong)bVar5 * -2 + 1) * 8);
      iVar4._M_current =
           (Matrix<double,_4,_4,_0,_4,_4> *)((long)iVar4._M_current + ((ulong)bVar5 * -2 + 1) * 8);
    }
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations3L1Q(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	vector<Matrix<floatPrec, 4,4>> out;
	out.push_back(transU);
	out.push_back(transU_B);

	return out;
}